

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O2

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *str,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,bool compress)

{
  size_type sVar1;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __pos = 0;
  sVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,str->_M_str,0,
                     str->_M_len);
  while (sVar1 != 0xffffffffffffffff) {
    if (sVar1 - __pos == 0) {
      if ((char)delimiterCharacters == '\0') {
        local_48 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,&local_48);
      }
    }
    else {
      local_48 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)this,__pos,
                            sVar1 - __pos);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,&local_48);
    }
    __pos = sVar1 + 1;
    sVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,str->_M_str,__pos,
                       str->_M_len);
  }
  if (__pos < *(ulong *)this) {
    local_48 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)this,__pos,
                          0xffffffffffffffff);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,&local_48);
  }
  else if ((char)delimiterCharacters == '\0') {
    local_48 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_string_split(
    const X& str,
    const X& delimiterCharacters,
    bool compress)
{
    std::vector<XO> ret;

    auto pos = str.find_first_of(delimiterCharacters);
    decltype(pos) start = 0;
    while (pos != X::npos) {
        if (pos != start) {
            ret.emplace_back(str.substr(start, pos - start));
        } else if (!compress) {
            ret.push_back(XO());
        }
        start = pos + 1;
        pos = str.find_first_of(delimiterCharacters, start);
    }
    if (start < str.length()) {
        ret.emplace_back(str.substr(start));
    } else if (!compress) {
        ret.push_back(XO());
    }
    return ret;
}